

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klogic.h
# Opt level: O0

cmplx klogic::activation(int k,cmplx *z)

{
  uint n;
  complex<double> cVar1;
  double local_30;
  cmplx *local_28;
  cmplx *z_local;
  int k_local;
  
  local_28 = z;
  z_local._4_4_ = k;
  if (k == 0) {
    local_30 = std::abs<double>(z);
    cVar1 = std::operator/(z,&local_30);
  }
  else {
    n = sector_number(k,z);
    cVar1._M_value = (_ComplexT)epsilon(n,z_local._4_4_);
  }
  return (cmplx)cVar1._M_value;
}

Assistant:

inline cmplx activation(int k, const cmplx &z) {
        if (k == 0)
            return z / std::abs(z);
        else {
            return epsilon(sector_number(k, z), k);
        }
    }